

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

void LogLuv24toXYZ(uint32_t p,float *XYZ)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  double dVar5;
  double v;
  double u;
  double local_38;
  double local_30;
  double local_28;
  
  local_28 = LogL10toY(p >> 0xe & 0x3ff);
  if (local_28 <= 0.0) {
    XYZ[2] = 0.0;
    XYZ[0] = 0.0;
    XYZ[1] = 0.0;
  }
  else {
    iVar1 = uv_decode(&local_30,&local_38,p & 0x3fff);
    if (iVar1 < 0) {
      uVar2 = 0x94b8199e;
      uVar3 = 0x3fde50d7;
      local_30 = 0.210526316;
    }
    else {
      uVar2 = SUB84(local_38,0);
      uVar3 = (undefined4)((ulong)local_38 >> 0x20);
    }
    dVar5 = 1.0 / (local_30 * 6.0 + (double)CONCAT44(uVar3,uVar2) * -16.0 + 12.0);
    dVar4 = local_30 * 9.0 * dVar5;
    dVar5 = (double)CONCAT44(uVar3,uVar2) * 4.0 * dVar5;
    *(ulong *)XYZ = CONCAT44((float)local_28,(float)((dVar4 / dVar5) * local_28));
    XYZ[2] = (float)((((1.0 - dVar4) - dVar5) / dVar5) * local_28);
  }
  return;
}

Assistant:

void
    LogLuv24toXYZ(uint32_t p, float *XYZ)
{
    int Ce;
    double L, u, v, s, x, y;
    /* decode luminance */
    L = LogL10toY(p >> 14 & 0x3ff);
    if (L <= 0.)
    {
        XYZ[0] = XYZ[1] = XYZ[2] = 0.;
        return;
    }
    /* decode color */
    Ce = p & 0x3fff;
    if (uv_decode(&u, &v, Ce) < 0)
    {
        u = U_NEU;
        v = V_NEU;
    }
    s = 1. / (6. * u - 16. * v + 12.);
    x = 9. * u * s;
    y = 4. * v * s;
    /* convert to XYZ */
    XYZ[0] = (float)(x / y * L);
    XYZ[1] = (float)L;
    XYZ[2] = (float)((1. - x - y) / y * L);
}